

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O0

FilenameBuilder * __thiscall GOESRProduct::getFilenameBuilder(GOESRProduct *this,Handler *config)

{
  __syscall_slong_t _Var1;
  long in_RDX;
  GOESRProduct *in_RSI;
  FilenameBuilder *in_RDI;
  FilenameBuilder *fb;
  Product *this_00;
  FilenameBuilder *this_01;
  Product local_50;
  
  local_50.nameLong.field_2._M_local_buf[7] = '\0';
  this_01 = in_RDI;
  local_50.nameLong.field_2._8_8_ = in_RDX;
  FilenameBuilder::FilenameBuilder(in_RDI);
  std::__cxx11::string::operator=
            ((string *)in_RDI,(string *)(local_50.nameLong.field_2._8_8_ + 0x88));
  getHeader<lrit::AnnotationHeader>(in_RSI);
  removeSuffix((string *)in_RSI);
  this_00 = &local_50;
  std::__cxx11::string::operator=((string *)&in_RDI->filename,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  lrit::AnnotationHeader::~AnnotationHeader((AnnotationHeader *)0x29d3fa);
  _Var1 = (in_RSI->frameStart_).tv_nsec;
  (in_RDI->time).tv_sec = (in_RSI->frameStart_).tv_sec;
  (in_RDI->time).tv_nsec = _Var1;
  Product::operator=((Product *)this_01,this_00);
  Region::operator=((Region *)this_01,(Region *)this_00);
  Channel::operator=((Channel *)this_01,(Channel *)this_00);
  return this_01;
}

Assistant:

FilenameBuilder GOESRProduct::getFilenameBuilder(const Config::Handler& config) const {
  FilenameBuilder fb;
  fb.dir = config.dir;
  fb.filename = removeSuffix(getHeader<lrit::AnnotationHeader>().text);
  fb.time = frameStart_;
  fb.product = product_;
  fb.region = region_;
  fb.channel = channel_;
  return fb;
}